

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atf-c.c
# Opt level: O1

void microatf_fail_check(char *msg,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int exit_code;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar1;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined8 local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [8];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_c0 = in_RSI;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  if (microatf_context_static.expect == MICROATF_EXPECT_PASS) {
    fwrite("*** Check failed: ",0x12,1,_stderr);
    local_d8 = local_c8;
    local_e0 = &stack0x00000008;
    local_e8 = 0x3000000008;
    vfprintf(_stderr,msg,&local_e8);
    fputc(10,_stderr);
    microatf_context_static.fail_count = microatf_context_static.fail_count + 1;
  }
  else {
    if (microatf_context_static.expect != MICROATF_EXPECT_FAIL) {
      local_d8 = local_c8;
      local_e0 = &stack0x00000008;
      local_e8 = 0x3000000018;
      uVar1 = (ulong)(uint)local_b8;
      exit_code = 0x10312e;
      microatf_context_write_result
                ((microatf_context_t *)msg,"failed",(int)in_RDX,"%s:%d: %s",in_RSI,uVar1,
                 "Test case raised a failure but was not expecting one");
      microatf_context_exit((microatf_context_t *)0x1,exit_code);
    }
    fwrite("*** Expected check failure: ",0x1c,1,_stderr);
    local_d8 = local_c8;
    local_e0 = &stack0x00000008;
    local_e8 = 0x3000000008;
    vfprintf(_stderr,msg,&local_e8);
    fputc(10,_stderr);
    microatf_context_static.expect_fail_count = microatf_context_static.expect_fail_count + 1;
  }
  return;
}

Assistant:

void
microatf_fail_check(char const *msg, ...)
{
	microatf_context_t *context = microatf_context;

	if (context->expect == MICROATF_EXPECT_FAIL) {
		fprintf(stderr, "*** Expected check failure: ");

		va_list args;
		va_start(args, msg);
		vfprintf(stderr, msg, args);
		va_end(args);

		fprintf(stderr, "\n");

		context->expect_fail_count++;
	} else if (context->expect == MICROATF_EXPECT_PASS) {
		fprintf(stderr, "*** Check failed: ");

		va_list args;
		va_start(args, msg);
		vfprintf(stderr, msg, args);
		va_end(args);

		fprintf(stderr, "\n");

		context->fail_count++;
	} else {
		va_list args;
		va_start(args, msg);
		char const *file = va_arg(args, char const *);
		int line = va_arg(args, int);
		microatf_context_write_result(context, "failed", -1,
		    "%s:%d: %s", file, line,
		    "Test case raised a failure but was not expecting one");
		va_end(args);

		microatf_context_exit(context, EXIT_FAILURE);
	}
}